

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall Search::predictor::~predictor(predictor *this)

{
  predictor *in_RDI;
  
  if ((in_RDI->oracle_is_pointer & 1U) == 0) {
    v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_RDI);
  }
  if ((in_RDI->allowed_is_pointer & 1U) == 0) {
    v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_RDI);
  }
  if ((in_RDI->allowed_cost_is_pointer & 1U) == 0) {
    v_array<float>::delete_v((v_array<float> *)in_RDI);
  }
  free_ec(in_RDI);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_RDI);
  v_array<char>::delete_v((v_array<char> *)in_RDI);
  return;
}

Assistant:

predictor::~predictor()
{
  if (!oracle_is_pointer)
    oracle_actions.delete_v();
  if (!allowed_is_pointer)
    allowed_actions.delete_v();
  if (!allowed_cost_is_pointer)
    allowed_actions_cost.delete_v();
  free_ec();
  condition_on_tags.delete_v();
  condition_on_names.delete_v();
}